

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st_tree_detail.h
# Opt level: O0

void __thiscall
st_tree::detail::max_maintainer<unsigned_long,_std::allocator<int>_>::insert
          (max_maintainer<unsigned_long,_std::allocator<int>_> *this,unsigned_long *n)

{
  ulong uVar1;
  size_type sVar2;
  reference pvVar3;
  value_type_conflict2 local_20;
  size_type *local_18;
  unsigned_long *n_local;
  max_maintainer<unsigned_long,_std::allocator<int>_> *this_local;
  
  uVar1 = *n;
  local_18 = n;
  n_local = (unsigned_long *)this;
  sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(&this->_hist);
  if (sVar2 <= uVar1) {
    local_20 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->_hist,*local_18 + 1,&local_20);
  }
  pvVar3 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     (&this->_hist,*local_18);
  *pvVar3 = *pvVar3 + 1;
  if (this->_max < *local_18) {
    this->_max = *local_18;
  }
  return;
}

Assistant:

void insert(const Unsigned& n) {
        if (n >= _hist.size()) _hist.resize(1+n, 0);
        _hist[n] += 1;
        if (n > _max) _max = n;
    }